

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O3

Gia_Obj_t * Gia_ManAddStrash(Gia_Man_t *p,Gia_Obj_t *p0,Gia_Obj_t *p1)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  Gia_Obj_t *pGVar11;
  Gia_Obj_t *pGVar12;
  
  if (p->fAddStrash == 0) {
    __assert_fail("p->fAddStrash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                  ,0x159,"Gia_Obj_t *Gia_ManAddStrash(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  puVar8 = (ulong *)((ulong)p0 & 0xfffffffffffffffe);
  pGVar7 = (Gia_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
  uVar9 = *puVar8;
  if ((int)uVar9 < 0 || (uVar9 & 0x1fffffff) == 0x1fffffff) {
    uVar9 = *(ulong *)pGVar7;
    uVar10 = uVar9 & 0x1fffffff;
    pGVar12 = (Gia_Obj_t *)0x0;
    pGVar6 = (Gia_Obj_t *)0x0;
    if (uVar10 == 0x1fffffff || (int)uVar9 < 0) {
      return (Gia_Obj_t *)0x0;
    }
  }
  else {
    pGVar12 = (Gia_Obj_t *)
              ((ulong)((uint)(uVar9 >> 0x1d) & 1) | (long)puVar8 + (uVar9 & 0x1fffffff) * -0xc);
    pGVar6 = (Gia_Obj_t *)
             ((ulong)((uint)(uVar9 >> 0x3d) & 1) |
             (long)puVar8 + (uVar9 >> 0x20 & 0x1fffffff) * -0xc);
    uVar9 = *(ulong *)pGVar7;
    uVar10 = uVar9 & 0x1fffffff;
  }
  if ((int)uVar10 == 0x1fffffff || (int)uVar9 < 0) {
    pGVar11 = (Gia_Obj_t *)0x0;
    pGVar5 = (Gia_Obj_t *)0x0;
  }
  else {
    pGVar11 = (Gia_Obj_t *)((ulong)((uint)(uVar9 >> 0x1d) & 1) | (ulong)(pGVar7 + -uVar10));
    uVar2 = (uint)(uVar9 >> 0x20);
    pGVar5 = (Gia_Obj_t *)
             ((ulong)(uVar2 >> 0x1d & 1) | (ulong)(pGVar7 + -(ulong)(uVar2 & 0x1fffffff)));
  }
  pGVar3 = (Gia_Obj_t *)((ulong)p1 ^ 1);
  if (((ulong)p0 & 1) == 0) {
    if (pGVar6 == pGVar3 || pGVar12 == pGVar3) goto LAB_00209dd9;
    if (pGVar12 == p1) {
      return p0;
    }
    if (pGVar6 == p1) {
      return p0;
    }
  }
  else {
    if (pGVar6 == pGVar3 || pGVar12 == pGVar3) {
      return p1;
    }
    if (pGVar6 == p1) {
      pGVar5 = (Gia_Obj_t *)((ulong)pGVar12 & 0xfffffffffffffffe);
      pGVar6 = p->pObjs;
      if ((pGVar6 <= pGVar5) && (pGVar5 < pGVar6 + p->nObjs)) {
        iVar4 = (int)((ulong)((long)pGVar5 - (long)pGVar6) >> 2);
        if (-1 < iVar4 * -0x55555555) {
          if ((pGVar7 < pGVar6) || (pGVar6 + p->nObjs <= pGVar7)) goto LAB_0020a162;
          iVar1 = (int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * -0x55555555;
          if (-1 < iVar1) {
            uVar2 = ((uint)pGVar12 & 1) + iVar4 * 0x55555556;
LAB_00209f8d:
            uVar2 = Gia_ManHashAnd(p,uVar2 ^ 1,((uint)p1 & 1) + iVar1 * 2);
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (p->nObjs <= (int)(uVar2 >> 1)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            return (Gia_Obj_t *)((ulong)(uVar2 & 1) ^ (ulong)(p->pObjs + (uVar2 >> 1)));
          }
        }
LAB_0020a181:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
LAB_0020a162:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (pGVar12 == p1) {
      pGVar5 = (Gia_Obj_t *)((ulong)pGVar6 & 0xfffffffffffffffe);
      pGVar12 = p->pObjs;
      if ((pGVar12 <= pGVar5) && (pGVar5 < pGVar12 + p->nObjs)) {
        iVar4 = (int)((ulong)((long)pGVar5 - (long)pGVar12) >> 2);
        if (-1 < iVar4 * -0x55555555) {
          if ((pGVar7 < pGVar12) || (pGVar12 + p->nObjs <= pGVar7)) goto LAB_0020a162;
          iVar1 = (int)((ulong)((long)pGVar7 - (long)pGVar12) >> 2) * -0x55555555;
          if (-1 < iVar1) {
            uVar2 = ((uint)pGVar6 & 1) + iVar4 * 0x55555556;
            goto LAB_00209f8d;
          }
        }
        goto LAB_0020a181;
      }
      goto LAB_0020a162;
    }
  }
  pGVar7 = (Gia_Obj_t *)((ulong)p0 ^ 1);
  if (((ulong)p1 & 1) == 0) {
    if (pGVar5 == pGVar7 || pGVar11 == pGVar7) {
LAB_00209dd9:
      return p->pObjs;
    }
    if (pGVar11 == p0) {
      return p1;
    }
    if (pGVar5 == p0) {
      return p1;
    }
    pGVar3 = (Gia_Obj_t *)((ulong)pGVar11 ^ 1);
    pGVar7 = p1;
    if (((ulong)p0 & 1) == 0) {
      if ((((pGVar12 == pGVar3) || (pGVar12 == (Gia_Obj_t *)((ulong)pGVar5 ^ 1))) ||
          (pGVar6 == pGVar3)) || (pGVar6 == (Gia_Obj_t *)((ulong)pGVar5 ^ 1))) goto LAB_00209dd9;
      pGVar7 = pGVar5;
      pGVar3 = p0;
      if (((pGVar12 != pGVar11) && (pGVar6 != pGVar11)) &&
         ((pGVar7 = p1, pGVar3 = pGVar12, pGVar6 != pGVar5 &&
          (pGVar7 = pGVar11, pGVar3 = p0, pGVar12 != pGVar5)))) {
        return (Gia_Obj_t *)0x0;
      }
    }
    else {
      if (pGVar12 == pGVar3) {
        return p1;
      }
      if (pGVar12 == (Gia_Obj_t *)((ulong)pGVar5 ^ 1)) {
        return p1;
      }
      if (pGVar6 == pGVar3) {
        return p1;
      }
      if (pGVar6 == (Gia_Obj_t *)((ulong)pGVar5 ^ 1)) {
        return p1;
      }
      if ((pGVar6 == pGVar11) || (pGVar6 == pGVar5)) {
        pGVar3 = (Gia_Obj_t *)((ulong)pGVar12 ^ 1);
      }
      else {
        if ((pGVar12 != pGVar11) && (pGVar12 != pGVar5)) {
          return (Gia_Obj_t *)0x0;
        }
        pGVar3 = (Gia_Obj_t *)((ulong)pGVar6 ^ 1);
      }
    }
  }
  else {
    if (pGVar5 == pGVar7 || pGVar11 == pGVar7) {
      return p0;
    }
    if (pGVar5 == p0) {
      pGVar7 = pGVar5;
      pGVar3 = (Gia_Obj_t *)((ulong)pGVar11 ^ 1);
    }
    else if (pGVar11 == p0) {
      pGVar7 = pGVar11;
      pGVar3 = (Gia_Obj_t *)((ulong)pGVar5 ^ 1);
    }
    else {
      if (((ulong)p0 & 1) != 0) {
        if ((pGVar12 == pGVar5) && (pGVar6 == (Gia_Obj_t *)((ulong)pGVar11 ^ 1))) {
LAB_0020a0c6:
          return (Gia_Obj_t *)((ulong)pGVar12 ^ 1);
        }
        if ((pGVar6 != pGVar11) || (pGVar12 != (Gia_Obj_t *)((ulong)pGVar5 ^ 1))) {
          if ((pGVar12 == pGVar11) && (pGVar6 == (Gia_Obj_t *)((ulong)pGVar5 ^ 1)))
          goto LAB_0020a0c6;
          if (pGVar6 != pGVar5) {
            return (Gia_Obj_t *)0x0;
          }
          if (pGVar12 != (Gia_Obj_t *)((ulong)pGVar11 ^ 1)) {
            return (Gia_Obj_t *)0x0;
          }
        }
        return (Gia_Obj_t *)((ulong)pGVar6 ^ 1);
      }
      if (pGVar11 == (Gia_Obj_t *)((ulong)pGVar12 ^ 1)) {
        return p0;
      }
      if (pGVar11 == (Gia_Obj_t *)((ulong)pGVar6 ^ 1)) {
        return p0;
      }
      if (pGVar5 == (Gia_Obj_t *)((ulong)pGVar12 ^ 1)) {
        return p0;
      }
      if (pGVar5 == (Gia_Obj_t *)((ulong)pGVar6 ^ 1)) {
        return p0;
      }
      pGVar3 = pGVar11;
      if ((((pGVar5 != pGVar12) && (pGVar5 != pGVar6)) && (pGVar3 = pGVar5, pGVar11 != pGVar12)) &&
         (pGVar11 != pGVar6)) {
        return (Gia_Obj_t *)0x0;
      }
      pGVar7 = p0;
      pGVar3 = (Gia_Obj_t *)((ulong)pGVar3 ^ 1);
    }
  }
  pGVar7 = Gia_ManHashAndP(p,pGVar3,pGVar7);
  return pGVar7;
}

Assistant:

static inline Gia_Obj_t * Gia_ManAddStrash( Gia_Man_t * p, Gia_Obj_t * p0, Gia_Obj_t * p1 )  
{ 
    Gia_Obj_t * pNode0, * pNode1, * pFanA, * pFanB, * pFanC, * pFanD;
    assert( p->fAddStrash );
    pNode0 = Gia_Regular(p0);
    pNode1 = Gia_Regular(p1);
    if ( !Gia_ObjIsAnd(pNode0) && !Gia_ObjIsAnd(pNode1) )
        return NULL;
    pFanA = Gia_ObjIsAnd(pNode0) ? Gia_ObjChild0(pNode0) : NULL;
    pFanB = Gia_ObjIsAnd(pNode0) ? Gia_ObjChild1(pNode0) : NULL;
    pFanC = Gia_ObjIsAnd(pNode1) ? Gia_ObjChild0(pNode1) : NULL;
    pFanD = Gia_ObjIsAnd(pNode1) ? Gia_ObjChild1(pNode1) : NULL;
    if ( Gia_IsComplement(p0) )
    {
        if ( pFanA == Gia_Not(p1) || pFanB == Gia_Not(p1) )
            return p1;
        if ( pFanB == p1 )
            return Gia_ManHashAndP( p, Gia_Not(pFanA), pFanB );
        if ( pFanA == p1 )
            return Gia_ManHashAndP( p, Gia_Not(pFanB), pFanA );
    }
    else
    {
        if ( pFanA == Gia_Not(p1) || pFanB == Gia_Not(p1) )
            return Gia_ManConst0(p);
        if ( pFanA == p1 || pFanB == p1 )
            return p0;
    }
    if ( Gia_IsComplement(p1) )
    {
        if ( pFanC == Gia_Not(p0) || pFanD == Gia_Not(p0) )
            return p0;
        if ( pFanD == p0 )
            return Gia_ManHashAndP( p, Gia_Not(pFanC), pFanD );
        if ( pFanC == p0 )
            return Gia_ManHashAndP( p, Gia_Not(pFanD), pFanC );
    }
    else
    {
        if ( pFanC == Gia_Not(p0) || pFanD == Gia_Not(p0) )
            return Gia_ManConst0(p);
        if ( pFanC == p0 || pFanD == p0 )
            return p1;
    }
    if ( !Gia_IsComplement(p0) && !Gia_IsComplement(p1) ) 
    {
        if ( pFanA == Gia_Not(pFanC) || pFanA == Gia_Not(pFanD) || pFanB == Gia_Not(pFanC) || pFanB == Gia_Not(pFanD) )
            return Gia_ManConst0(p);
        if ( pFanA == pFanC || pFanB == pFanC )
            return Gia_ManHashAndP( p, p0, pFanD );
        if ( pFanB == pFanC || pFanB == pFanD )
            return Gia_ManHashAndP( p, pFanA, p1 );
        if ( pFanA == pFanD || pFanB == pFanD )
            return Gia_ManHashAndP( p, p0, pFanC );
        if ( pFanA == pFanC || pFanA == pFanD )
            return Gia_ManHashAndP( p, pFanB, p1 );
    }
    else if ( Gia_IsComplement(p0) && !Gia_IsComplement(p1) )
    {
        if ( pFanA == Gia_Not(pFanC) || pFanA == Gia_Not(pFanD) || pFanB == Gia_Not(pFanC) || pFanB == Gia_Not(pFanD) )
            return p1;
        if ( pFanB == pFanC || pFanB == pFanD )
            return Gia_ManHashAndP( p, Gia_Not(pFanA), p1 );
        if ( pFanA == pFanC || pFanA == pFanD )
            return Gia_ManHashAndP( p, Gia_Not(pFanB), p1 );
    }
    else if ( !Gia_IsComplement(p0) && Gia_IsComplement(p1) )
    {
        if ( pFanC == Gia_Not(pFanA) || pFanC == Gia_Not(pFanB) || pFanD == Gia_Not(pFanA) || pFanD == Gia_Not(pFanB) )
            return p0;
        if ( pFanD == pFanA || pFanD == pFanB )
            return Gia_ManHashAndP( p, Gia_Not(pFanC), p0 );
        if ( pFanC == pFanA || pFanC == pFanB )
            return Gia_ManHashAndP( p, Gia_Not(pFanD), p0 );
    }
    else // if ( Gia_IsComplement(p0) && Gia_IsComplement(p1) )
    {
        if ( pFanA == pFanD && pFanB == Gia_Not(pFanC) )
            return Gia_Not(pFanA);
        if ( pFanB == pFanC && pFanA == Gia_Not(pFanD) )
            return Gia_Not(pFanB);
        if ( pFanA == pFanC && pFanB == Gia_Not(pFanD) )
            return Gia_Not(pFanA);
        if ( pFanB == pFanD && pFanA == Gia_Not(pFanC) )
            return Gia_Not(pFanB);
    }
/*
    if ( !Gia_IsComplement(p0) || !Gia_IsComplement(p1) )
        return NULL;
    if ( !Gia_ObjIsAnd(pNode0) || !Gia_ObjIsAnd(pNode1) )
        return NULL;
    if ( (Gia_ObjFanin0(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC0(pNode1))) || 
         (Gia_ObjFanin0(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC1(pNode1))) ||
         (Gia_ObjFanin1(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC0(pNode1))) ||
         (Gia_ObjFanin1(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC1(pNode1))) )
    {
        Gia_Obj_t * pNodeC, * pNodeT, * pNodeE;
        int fCompl;
        pNodeC = Gia_ObjRecognizeMuxTwo( pNode0, pNode1, &pNodeT, &pNodeE );
        // using non-standard canonical rule for MUX (d0 is not compl; d1 may be compl)
        if ( (fCompl = Gia_IsComplement(pNodeE)) )
        {
            pNodeE = Gia_Not(pNodeE);
            pNodeT = Gia_Not(pNodeT);
        }
        pNode0 = Gia_ManHashAndP( p, Gia_Not(pNodeC), pNodeE );
        pNode1 = Gia_ManHashAndP( p, pNodeC,          pNodeT );
        p->fAddStrash = 0;
        pNodeC = Gia_NotCond( Gia_ManHashAndP( p, Gia_Not(pNode0), Gia_Not(pNode1) ), !fCompl );
        p->fAddStrash = 1;
        return pNodeC;
    }
*/
    return NULL;
}